

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

Call * __thiscall
wasm::I64ToI32Lowering::visitGenericCall<wasm::Call>
          (I64ToI32Lowering *this,Call *curr,BuilderFunc<wasm::Call> *callBuilder)

{
  Builder *pBVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  undefined4 uVar4;
  Type TVar5;
  bool bVar6;
  iterator iVar7;
  Call *value;
  LocalSet *any;
  Expression *pEVar8;
  LocalSet *append;
  Block *pBVar9;
  Call *expression;
  ulong uVar10;
  undefined1 local_b8 [8];
  TempVar highBits;
  undefined1 local_90 [8];
  TempVar lowBits;
  void *pvStack_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Block *local_38;
  
  bVar6 = handleUnreachable(this,(Expression *)curr);
  if (bVar6) {
    value = (Call *)0x0;
  }
  else {
    pvStack_58 = (void *)0x0;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lowBits.ty.id =
         (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
         .usedElements;
    highBits.ty.id = (uintptr_t)callBuilder;
    if (lowBits.ty.id == 0) {
      bVar6 = false;
    }
    else {
      bVar6 = false;
      uVar10 = 0;
      do {
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar10) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        local_b8 = (undefined1  [8])
                   (curr->operands).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                   [uVar10];
        if (args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
            .super__Vector_impl_data._M_start ==
            args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pvStack_58,
                     (iterator)
                     args.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(Expression **)local_b8);
        }
        else {
          *args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Vector_impl_data._M_start = (Expression *)local_b8;
          args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        local_90 = local_b8;
        iVar7 = std::
                _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->highBitVars)._M_h,(key_type *)local_90);
        if (iVar7.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
            ._M_cur != (__node_type *)0x0) {
          fetchOutParam((TempVar *)local_90,this,(Expression *)local_b8);
          if ((char)lowBits.pass == '\x01') goto LAB_008d53df;
          uVar4 = local_90._0_4_;
          local_38 = (Block *)MixedArena::allocSpace
                                        (&((this->builder)._M_t.
                                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                           .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                          _M_head_impl)->wasm->allocator,0x18,8);
          (local_38->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id =
               LocalGetId;
          *(undefined4 *)&(local_38->name).super_IString.str._M_len = uVar4;
          (local_38->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 2
          ;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pvStack_58,
                     (Expression **)&local_38);
          TempVar::~TempVar((TempVar *)local_90);
          bVar6 = true;
        }
        uVar10 = uVar10 + 1;
      } while (lowBits.ty.id != uVar10);
    }
    pEVar8 = (Expression *)
             (curr->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id;
    if (pEVar8 == (Expression *)0x3) {
      getTemp((TempVar *)local_90,this,(Type)0x2);
      TVar5 = highBits.ty;
      getTemp((TempVar *)local_b8,this,(Type)0x2);
      local_38 = (Block *)0x2;
      if (*(long *)(TVar5.id + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      value = (Call *)(**(code **)(TVar5.id + 0x18))(TVar5.id,&pvStack_58,&local_38);
      if ((char)lowBits.pass == '\x01') {
LAB_008d53df:
        __assert_fail("!moved",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
      }
      any = Builder::makeLocalSet
                      ((this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,local_90._0_4_,
                       (Expression *)value);
      uVar3 = DAT_010b1008;
      uVar2 = INT64_TO_32_HIGH_BITS;
      if ((char)highBits.pass == '\x01') goto LAB_008d53df;
      pBVar1 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      uVar4 = local_b8._0_4_;
      lowBits.ty.id = (uintptr_t)this;
      pEVar8 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x20,8);
      pEVar8->_id = GlobalGetId;
      *(undefined8 *)(pEVar8 + 1) = uVar2;
      pEVar8[1].type.id = uVar3;
      (pEVar8->type).id = 2;
      append = Builder::makeLocalSet(pBVar1,uVar4,pEVar8);
      TVar5 = lowBits.ty;
      if ((char)lowBits.pass == '\x01') goto LAB_008d53df;
      uVar4 = local_90._0_4_;
      pEVar8 = (Expression *)
               MixedArena::allocSpace
                         ((MixedArena *)(**(long **)(lowBits.ty.id + 0x130) + 0x200),0x18,8);
      pEVar8->_id = LocalGetId;
      *(undefined4 *)(pEVar8 + 1) = uVar4;
      (pEVar8->type).id = 2;
      pBVar1 = *(Builder **)(TVar5.id + 0x130);
      pBVar9 = Builder::blockify(pBVar1,(Expression *)any,(Expression *)append);
      pBVar9 = Builder::blockify(pBVar1,(Expression *)pBVar9,pEVar8);
      local_38 = pBVar9;
      std::
      _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)(TVar5.id + 0x1a8),&local_38,local_b8);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                ((Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_> *)
                 (TVar5.id + 0x58),(Expression *)pBVar9);
      TempVar::~TempVar((TempVar *)local_b8);
      TempVar::~TempVar((TempVar *)local_90);
    }
    else {
      local_90 = (undefined1  [8])pEVar8;
      if (*(long *)(highBits.ty.id + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      expression = (Call *)(**(code **)(highBits.ty.id + 0x18))(highBits.ty.id,&pvStack_58,local_90)
      ;
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      value = (Call *)0x0;
      if (bVar6) {
        value = expression;
      }
    }
    if (pvStack_58 != (void *)0x0) {
      operator_delete(pvStack_58,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvStack_58);
    }
  }
  return value;
}

Assistant:

T* visitGenericCall(T* curr, BuilderFunc<T> callBuilder) {
    if (handleUnreachable(curr)) {
      return nullptr;
    }
    bool fixed = false;
    std::vector<Expression*> args;
    for (auto* e : curr->operands) {
      args.push_back(e);
      if (hasOutParam(e)) {
        TempVar argHighBits = fetchOutParam(e);
        args.push_back(builder->makeLocalGet(argHighBits, Type::i32));
        fixed = true;
      }
    }
    if (curr->type != Type::i64) {
      auto* ret = callBuilder(args, curr->type);
      replaceCurrent(ret);
      return fixed ? ret : nullptr;
    }
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    auto* call = callBuilder(args, Type::i32);
    LocalSet* doCall = builder->makeLocalSet(lowBits, call);
    LocalSet* setHigh = builder->makeLocalSet(
      highBits, builder->makeGlobalGet(INT64_TO_32_HIGH_BITS, Type::i32));
    LocalGet* getLow = builder->makeLocalGet(lowBits, Type::i32);
    Block* result = builder->blockify(doCall, setHigh, getLow);
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
    return call;
  }